

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float *pfVar2;
  size_type sVar3;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar8;
  float *outptr_1;
  int i_4;
  Mat *roi_score_blob;
  float *outptr;
  int i_3;
  Mat *roi_blob;
  int picked_count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  Rect r;
  float pb_h_1;
  float pb_w_1;
  float *pb_2;
  int i_2;
  float *scoreptr;
  Mat pbs_2;
  int q_2;
  float min_boxsize;
  float im_scale;
  vector<float,_std::allocator<float>_> scores;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  float *pb_1;
  int i_1;
  Mat pbs_1;
  int q_1;
  float im_h;
  float im_w;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float cy;
  float cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float *pb;
  int j;
  float anchor_x;
  int i;
  float anchor_h;
  float anchor_w;
  float anchor_y;
  float *anchor;
  Mat pbs;
  float *bbox_hptr;
  float *bbox_wptr;
  float *bbox_yptr;
  float *bbox_xptr;
  int q;
  Mat proposals;
  int num_anchors;
  int h;
  int w;
  Mat *im_info_blob;
  Mat *bbox_blob;
  Mat *score_blob;
  Mat *m_7;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_9;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  value_type *in_stack_fffffffffffff018;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff020;
  size_t in_stack_fffffffffffff028;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff030;
  int iVar9;
  undefined8 in_stack_fffffffffffff038;
  undefined7 in_stack_fffffffffffff040;
  undefined1 in_stack_fffffffffffff047;
  void **in_stack_fffffffffffff0c0;
  float fVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff0c8;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *in_stack_fffffffffffff0d0;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined8 local_d68;
  undefined4 local_d60;
  Allocator *local_d58;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined4 local_d44;
  undefined4 local_d40;
  undefined8 local_d38;
  vector<float,_std::allocator<float>_> *local_d30;
  int local_d24;
  reference local_d20;
  undefined8 local_d18;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined4 local_d00;
  Allocator *local_cf8;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined8 local_cd8;
  float *local_cd0;
  int local_cc8;
  undefined4 local_cc4;
  reference local_cc0;
  int local_cb8;
  int local_cb4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_cb0;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  float local_c88;
  float local_c84;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c80;
  int local_c74;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_c70;
  undefined4 local_c58;
  Allocator *local_c50;
  undefined4 local_c48;
  undefined4 local_c44;
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined8 local_c30;
  void *local_c28;
  void *local_c20;
  int *local_c18;
  ulong local_c10;
  undefined4 local_c08;
  long *local_c00;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  undefined4 local_bec;
  undefined4 local_be8;
  ulong local_be0;
  int local_bd4;
  float local_bd0;
  float local_bcc;
  vector<float,_std::allocator<float>_> local_bc8;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_bb0;
  float local_b98;
  float local_b94;
  float local_b90;
  float local_b8c;
  float local_b88;
  float local_b84;
  float local_b80;
  float local_b7c;
  float *local_b78;
  int local_b6c;
  void *local_b68;
  int *local_b60;
  ulong local_b58;
  undefined4 local_b50;
  long *local_b48;
  int local_b40;
  int local_b3c;
  int local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  ulong local_b28;
  int local_b1c;
  float local_b18;
  float local_b14;
  float local_b10;
  float local_b0c;
  float local_b08;
  float local_b04;
  float local_b00;
  float local_afc;
  float local_af8;
  float local_af4;
  float local_af0;
  float local_aec;
  float *local_ae8;
  int local_ae0;
  float local_adc;
  int local_ad8;
  float local_ad4;
  float local_ad0;
  float local_acc;
  float *local_ac8;
  void *local_ac0;
  int *local_ab8;
  ulong local_ab0;
  undefined4 local_aa8;
  long *local_aa0;
  int local_a98;
  int local_a94;
  int local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  ulong local_a80;
  undefined8 local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined4 local_a60;
  Allocator *local_a58;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined8 local_a38;
  void *local_a30;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined4 local_a10;
  Allocator *local_a08;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined8 local_9e8;
  void *local_9e0;
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 local_9c8;
  undefined4 local_9c0;
  Allocator *local_9b8;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined8 local_998;
  void *local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined8 local_978;
  undefined4 local_970;
  Allocator *local_968;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined8 local_948;
  void *local_940;
  int local_938;
  void *local_928;
  int *local_920;
  ulong local_918;
  undefined4 local_910;
  long *local_908;
  int local_900;
  int local_8fc;
  int local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  long local_8e8;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  const_reference local_8d0;
  const_reference local_8c8;
  const_reference local_8c0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_8b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_8a8;
  int local_894;
  void **local_890;
  undefined8 *local_888;
  undefined8 *local_878;
  undefined8 *local_868;
  undefined8 *local_858;
  void **local_848;
  void **local_838;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *local_828;
  void **local_818;
  undefined8 *local_808;
  undefined8 *local_7f8;
  void **local_7e8;
  undefined1 local_7d5;
  int local_7d4;
  const_reference local_7d0;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *local_7c8;
  undefined1 local_7b5;
  int local_7b4;
  const_reference local_7b0;
  undefined8 *local_7a8;
  undefined1 local_795;
  int local_794;
  const_reference local_790;
  undefined8 *local_788;
  undefined1 local_775;
  int local_774;
  const_reference local_770;
  undefined8 *local_768;
  undefined1 local_755;
  int local_754;
  const_reference local_750;
  undefined8 *local_748;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined1 local_70d;
  int local_70c;
  reference local_708;
  undefined8 *local_700;
  undefined1 local_6ed;
  int local_6ec;
  reference local_6e8;
  undefined8 *local_6e0;
  undefined1 local_6cd;
  int local_6cc;
  void **local_6c8;
  void **local_6c0;
  undefined1 local_6ad;
  int local_6ac;
  void **local_6a8;
  void **local_6a0;
  undefined1 local_68d;
  int local_68c;
  void **local_688;
  void **local_680;
  int local_66c;
  long *local_668;
  int local_65c;
  void **local_658;
  int local_64c;
  void **local_648;
  int local_63c;
  void **local_638;
  undefined8 local_630;
  const_reference local_628;
  undefined8 local_620;
  const_reference local_618;
  undefined8 local_610;
  const_reference local_608;
  reference local_600;
  reference local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  int local_530;
  undefined4 local_52c;
  void **local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  void **local_4c8;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *local_4a8;
  int local_490;
  undefined4 local_48c;
  void **local_488;
  int local_470;
  undefined4 local_46c;
  void **local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  undefined8 *local_3e8;
  void *local_3a0;
  void *local_390;
  void *local_370;
  void *local_340;
  long *local_2e0;
  undefined4 local_2d4;
  ulong local_2d0;
  void *local_2c8;
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  void **local_2b0;
  long *local_2a8;
  undefined4 local_29c;
  ulong local_298;
  void *local_290;
  undefined4 local_284;
  int local_280;
  int local_27c;
  void **local_278;
  long *local_270;
  undefined4 local_264;
  ulong local_260;
  void *local_258;
  undefined4 local_24c;
  int local_248;
  int local_244;
  void **local_240;
  Allocator *local_238;
  int local_22c;
  size_t local_228;
  float *local_220;
  int local_214;
  int local_210;
  int local_20c;
  undefined8 *local_208;
  Allocator *local_200;
  int local_1f4;
  size_t local_1f0;
  vector<float,_std::allocator<float>_> *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  void *local_178;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  Allocator *local_158;
  int local_14c;
  size_t local_148;
  void *local_140;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  void *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  Allocator *local_e8;
  int local_dc;
  size_t local_d8;
  void *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  reference local_10;
  reference local_8;
  
  local_8b0 = in_RDX;
  local_8a8 = in_RSI;
  local_8c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_8c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_8a8,1);
  local_8d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_8a8,2);
  local_8d4 = local_8c0->w;
  local_8d8 = local_8c0->h;
  local_8dc = *(int *)(in_RDI + 0x1a8);
  local_890 = &local_928;
  local_928 = (void *)0x0;
  local_920 = (int *)0x0;
  local_918 = 0;
  local_910 = 0;
  local_908 = (long *)0x0;
  local_900 = 0;
  local_8fc = 0;
  local_8f8 = 0;
  local_8f4 = 0;
  local_8f0 = 0;
  local_8e8 = 0;
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffff047,in_stack_fffffffffffff040),
              (int)((ulong)in_stack_fffffffffffff038 >> 0x20),(int)in_stack_fffffffffffff038,
              (int)((ulong)in_stack_fffffffffffff030 >> 0x20),in_stack_fffffffffffff028,
              (Allocator *)in_stack_fffffffffffff020);
  for (local_938 = 0; local_938 < local_8dc; local_938 = local_938 + 1) {
    local_754 = local_938 << 2;
    local_748 = &local_988;
    local_19c = local_8c8->w;
    local_1a0 = local_8c8->h;
    local_1a4 = local_8c8->d;
    local_940 = (void *)((long)local_8c8->data +
                        local_8c8->cstep * (long)local_754 * local_8c8->elemsize);
    local_1b8 = local_8c8->elemsize;
    local_1bc = local_8c8->elempack;
    local_1c8 = local_8c8->allocator;
    local_198 = &local_988;
    local_68 = (long)local_19c * (long)local_1a0 * local_1b8;
    local_718 = &local_988;
    local_888 = &local_988;
    local_774 = local_938 * 4 + 1;
    local_768 = &local_9d8;
    local_164 = local_8c8->w;
    local_168 = local_8c8->h;
    local_16c = local_8c8->d;
    local_990 = (void *)((long)local_8c8->data +
                        local_8c8->cstep * (long)local_774 * local_8c8->elemsize);
    local_180 = local_8c8->elemsize;
    local_184 = local_8c8->elempack;
    local_190 = local_8c8->allocator;
    local_160 = &local_9d8;
    local_78 = (long)local_164 * (long)local_168 * local_180;
    local_720 = &local_9d8;
    local_878 = &local_9d8;
    local_794 = local_938 * 4 + 2;
    local_788 = &local_a28;
    local_12c = local_8c8->w;
    local_130 = local_8c8->h;
    local_134 = local_8c8->d;
    local_9e0 = (void *)((long)local_8c8->data +
                        local_8c8->cstep * (long)local_794 * local_8c8->elemsize);
    local_148 = local_8c8->elemsize;
    local_14c = local_8c8->elempack;
    local_158 = local_8c8->allocator;
    local_128 = &local_a28;
    local_88 = (long)local_12c * (long)local_130 * local_148;
    local_728 = &local_a28;
    local_868 = &local_a28;
    local_7b4 = local_938 * 4 + 3;
    local_7a8 = &local_a78;
    local_f4 = local_8c8->w;
    local_f8 = local_8c8->h;
    local_fc = local_8c8->d;
    local_a30 = (void *)((long)local_8c8->data +
                        local_8c8->cstep * (long)local_7b4 * local_8c8->elemsize);
    local_110 = local_8c8->elemsize;
    local_114 = local_8c8->elempack;
    local_120 = local_8c8->allocator;
    local_f0 = &local_a78;
    local_98 = (long)local_f4 * (long)local_f8 * local_110;
    local_730 = &local_a78;
    local_858 = &local_a78;
    local_680 = &local_ac0;
    local_688 = &local_928;
    local_2c8 = (void *)((long)local_928 + local_8e8 * local_938 * local_918);
    local_2b0 = &local_ac0;
    local_18 = (long)local_8fc * (long)local_8f8 * local_918;
    local_a80 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_918;
    local_a98 = local_900 + -1;
    if (local_900 == 4) {
      local_a80 = (long)local_8fc * (long)local_8f8;
    }
    local_950 = 0;
    local_954 = 0;
    local_958 = 0;
    local_95c = 0;
    local_970 = 0;
    local_978 = 0;
    local_980 = 0;
    local_988 = 0;
    local_9a0 = 0;
    local_9a4 = 0;
    local_9a8 = 0;
    local_9ac = 0;
    local_9c0 = 0;
    local_9c8 = 0;
    local_9d0 = 0;
    local_9d8 = 0;
    local_9f0 = 0;
    local_9f4 = 0;
    local_9f8 = 0;
    local_9fc = 0;
    local_a10 = 0;
    local_a18 = 0;
    local_a20 = 0;
    local_a28 = 0;
    local_a40 = 0;
    local_a44 = 0;
    local_a48 = 0;
    local_a4c = 0;
    local_a60 = 0;
    local_a68 = 0;
    local_a70 = 0;
    local_a78 = 0;
    local_a88 = local_8f4;
    local_a8c = 1;
    local_a90 = local_8f8;
    local_a94 = local_8fc;
    local_aa0 = local_908;
    local_aa8 = local_910;
    local_ab0 = local_918;
    local_1c = 0x10;
    local_6c = 0x10;
    local_7c = 0x10;
    local_8c = 0x10;
    local_9c = 0x10;
    local_2b4 = local_8fc;
    local_2b8 = local_8f8;
    local_2bc = local_8f4;
    local_2d0 = local_918;
    local_2d4 = local_910;
    local_2e0 = local_908;
    local_68c = local_938;
    local_68d = 1;
    local_750 = local_8c8;
    local_755 = 1;
    local_770 = local_8c8;
    local_775 = 1;
    local_790 = local_8c8;
    local_795 = 1;
    local_7b0 = local_8c8;
    local_7b5 = 1;
    local_948 = 0;
    local_960 = 0;
    local_998 = 0;
    local_9b0 = 0;
    local_9e8 = 0;
    local_a00 = 0;
    local_a38 = 0;
    local_a50 = 0;
    local_ab8 = (int *)0x0;
    local_668 = (long *)(in_RDI + 0x178);
    local_66c = local_938;
    local_ac8 = (float *)(*local_668 +
                         (long)*(int *)(in_RDI + 0x1a4) * (long)local_938 *
                         *(long *)(in_RDI + 0x188));
    local_acc = local_ac8[1];
    local_ad0 = local_ac8[2] - *local_ac8;
    local_ad4 = local_ac8[3] - local_ac8[1];
    local_448 = local_858;
    local_428 = local_868;
    local_408 = local_878;
    local_3e8 = local_888;
    local_1b0 = local_940;
    local_178 = local_990;
    local_140 = local_9e0;
    local_108 = local_a30;
    local_ac0 = local_2c8;
    local_a58 = local_120;
    local_a08 = local_158;
    local_9b8 = local_190;
    local_968 = local_1c8;
    for (local_ad8 = 0; local_ad8 < local_8d8; local_ad8 = local_ad8 + 1) {
      local_adc = *local_ac8;
      for (local_ae0 = 0; fVar10 = local_ad0, local_ae0 < local_8d4; local_ae0 = local_ae0 + 1) {
        local_63c = local_ad8 * local_8d4 + local_ae0;
        local_638 = &local_ac0;
        local_ae8 = (float *)((long)local_ac0 + (long)local_a94 * (long)local_63c * local_ab0);
        local_aec = *(float *)((long)local_940 + (long)local_ae0 * 4);
        local_af0 = *(float *)((long)local_990 + (long)local_ae0 * 4);
        local_af4 = *(float *)((long)local_9e0 + (long)local_ae0 * 4);
        local_af8 = *(float *)((long)local_a30 + (long)local_ae0 * 4);
        local_afc = local_adc + local_ad0 * 0.5;
        local_b00 = local_acc + local_ad4 * 0.5;
        local_b04 = local_afc + local_ad0 * local_aec;
        local_b08 = local_b00 + local_ad4 * local_af0;
        local_b0c = expf(local_af4);
        fVar1 = local_ad4;
        local_b0c = fVar10 * local_b0c;
        local_b10 = expf(local_af8);
        local_b10 = fVar1 * local_b10;
        *local_ae8 = local_b04 - local_b0c * 0.5;
        local_ae8[1] = local_b08 - local_b10 * 0.5;
        local_ae8[2] = local_b04 + local_b0c * 0.5;
        local_ae8[3] = local_b08 + local_b10 * 0.5;
        local_adc = (float)*(int *)(in_RDI + 0xd0) + local_adc;
      }
      local_940 = (void *)((long)local_940 + (long)local_8d4 * 4);
      local_990 = (void *)((long)local_990 + (long)local_8d4 * 4);
      local_9e0 = (void *)((long)local_9e0 + (long)local_8d4 * 4);
      local_a30 = (void *)((long)local_a30 + (long)local_8d4 * 4);
      local_acc = (float)*(int *)(in_RDI + 0xd0) + local_acc;
    }
    local_848 = &local_ac0;
    local_468 = local_848;
    if (local_ab8 != (int *)0x0) {
      local_46c = 0xffffffff;
      LOCK();
      local_470 = *local_ab8;
      *local_ab8 = *local_ab8 + -1;
      UNLOCK();
      if (local_470 == 1) {
        if (local_aa0 == (long *)0x0) {
          local_3a0 = local_ac0;
          if (local_ac0 != (void *)0x0) {
            free(local_ac0);
          }
        }
        else {
          (**(code **)(*local_aa0 + 0x18))(local_aa0,local_ac0);
        }
      }
    }
    local_ac0 = (void *)0x0;
    local_ab0 = 0;
    local_aa8 = 0;
    local_a98 = 0;
    local_a94 = 0;
    local_a90 = 0;
    local_a8c = 0;
    local_a88 = 0;
    local_a80 = 0;
    local_ab8 = (int *)0x0;
  }
  local_608 = local_8d0;
  local_610 = 1;
  local_b14 = *(float *)((long)local_8d0->data + 4);
  local_618 = local_8d0;
  local_620 = 0;
  local_b18 = *local_8d0->data;
  for (local_b1c = 0; local_b1c < local_8dc; local_b1c = local_b1c + 1) {
    local_6a0 = &local_b68;
    local_6a8 = &local_928;
    local_290 = (void *)((long)local_928 + local_8e8 * local_b1c * local_918);
    local_278 = &local_b68;
    local_b60 = (int *)0x0;
    local_b58 = local_918;
    local_b50 = local_910;
    local_b48 = local_908;
    local_b3c = local_8fc;
    local_b38 = local_8f8;
    local_b34 = 1;
    local_b30 = local_8f4;
    local_28 = (long)local_8fc * (long)local_8f8 * local_918;
    local_b28 = (local_28 + 0xfU & 0xfffffffffffffff0) / local_918;
    local_b40 = local_900 + -1;
    if (local_900 == 4) {
      local_b28 = (long)local_8fc * (long)local_8f8;
    }
    local_2c = 0x10;
    local_27c = local_8fc;
    local_280 = local_8f8;
    local_284 = local_8f4;
    local_298 = local_918;
    local_29c = local_910;
    local_2a8 = local_908;
    local_6ac = local_b1c;
    local_6ad = 1;
    local_b68 = local_290;
    for (local_b6c = 0; local_b6c < local_8d4 * local_8d8; local_b6c = local_b6c + 1) {
      local_648 = &local_b68;
      local_64c = local_b6c;
      local_b78 = (float *)((long)local_b68 + (long)local_b3c * (long)local_b6c * local_b58);
      local_b7c = local_b14 + -1.0;
      pfVar2 = std::min<float>(local_b78,&local_b7c);
      local_b80 = 0.0;
      pfVar2 = std::max<float>(pfVar2,&local_b80);
      *local_b78 = *pfVar2;
      local_b84 = local_b18 + -1.0;
      pfVar2 = std::min<float>(local_b78 + 1,&local_b84);
      local_b88 = 0.0;
      pfVar2 = std::max<float>(pfVar2,&local_b88);
      local_b78[1] = *pfVar2;
      local_b8c = local_b14 + -1.0;
      pfVar2 = std::min<float>(local_b78 + 2,&local_b8c);
      local_b90 = 0.0;
      pfVar2 = std::max<float>(pfVar2,&local_b90);
      local_b78[2] = *pfVar2;
      local_b94 = local_b18 + -1.0;
      pfVar2 = std::min<float>(local_b78 + 3,&local_b94);
      local_b98 = 0.0;
      pfVar2 = std::max<float>(pfVar2,&local_b98);
      local_b78[3] = *pfVar2;
    }
    local_838 = &local_b68;
    local_488 = local_838;
    if (local_b60 != (int *)0x0) {
      local_48c = 0xffffffff;
      LOCK();
      local_490 = *local_b60;
      *local_b60 = *local_b60 + -1;
      UNLOCK();
      if (local_490 == 1) {
        if (local_b48 == (long *)0x0) {
          local_390 = local_b68;
          if (local_b68 != (void *)0x0) {
            free(local_b68);
          }
        }
        else {
          (**(code **)(*local_b48 + 0x18))(local_b48,local_b68);
        }
      }
    }
    local_b68 = (void *)0x0;
    local_b58 = 0;
    local_b50 = 0;
    local_b40 = 0;
    local_b3c = 0;
    local_b38 = 0;
    local_b34 = 0;
    local_b30 = 0;
    local_b28 = 0;
    local_b60 = (int *)0x0;
  }
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)0xd5fada);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0xd5fae7);
  local_628 = local_8d0;
  local_630 = 2;
  local_bcc = *(float *)((long)local_8d0->data + 8);
  local_bd0 = (float)*(int *)(in_RDI + 0xe4) * local_bcc;
  for (local_bd4 = 0; fVar10 = (float)((ulong)in_stack_fffffffffffff0c0 >> 0x20),
      local_bd4 < local_8dc; local_bd4 = local_bd4 + 1) {
    local_6c0 = &local_c20;
    local_6c8 = &local_928;
    local_258 = (void *)((long)local_928 + local_8e8 * local_bd4 * local_918);
    local_240 = &local_c20;
    local_38 = (long)local_8fc * (long)local_8f8 * local_918;
    local_be0 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_918;
    local_bf8 = local_900 + -1;
    if (local_900 == 4) {
      local_be0 = (long)local_8fc * (long)local_8f8;
    }
    local_7d4 = local_bd4 + local_8dc;
    local_7c8 = &local_c70;
    local_bc = local_8c0->w;
    local_c0 = local_8c0->h;
    local_c4 = local_8c0->d;
    local_c28 = (void *)((long)local_8c0->data +
                        local_8c0->cstep * (long)local_7d4 * local_8c0->elemsize);
    local_d8 = local_8c0->elemsize;
    local_dc = local_8c0->elempack;
    local_e8 = local_8c0->allocator;
    local_b8 = &local_c70;
    local_a8 = (long)local_bc * (long)local_c0 * local_d8;
    local_738 = &local_c70;
    in_stack_fffffffffffff0d0 = &local_c70;
    local_be8 = local_8f4;
    local_bec = 1;
    local_bf0 = local_8f8;
    local_bf4 = local_8fc;
    local_c00 = local_908;
    local_c08 = local_910;
    local_c10 = local_918;
    local_c18 = (int *)0x0;
    local_3c = 0x10;
    local_ac = 0x10;
    local_244 = local_8fc;
    local_248 = local_8f8;
    local_24c = local_8f4;
    local_260 = local_918;
    local_264 = local_910;
    local_270 = local_908;
    local_6cc = local_bd4;
    local_6cd = 1;
    local_7d0 = local_8c0;
    local_7d5 = 1;
    local_c70.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c70.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c58 = 0;
    local_c48 = 0;
    local_c44 = 0;
    local_c40 = 0;
    local_c3c = 0;
    local_c38 = 0;
    local_c30 = 0;
    local_c70.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_828 = in_stack_fffffffffffff0d0;
    local_4a8 = in_stack_fffffffffffff0d0;
    local_d0 = local_c28;
    local_c50 = local_e8;
    local_c20 = local_258;
    for (local_c74 = 0; local_c74 < local_8d4 * local_8d8; local_c74 = local_c74 + 1) {
      local_658 = &local_c20;
      local_65c = local_c74;
      in_stack_fffffffffffff0c8 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)local_c20 + (long)local_bf4 * (long)local_c74 * local_c10);
      local_c84 = (*(float *)&(in_stack_fffffffffffff0c8->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                  *(float *)&(in_stack_fffffffffffff0c8->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start) + 1.0;
      local_c88 = (*(float *)((long)&(in_stack_fffffffffffff0c8->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + 4) -
                  *(float *)((long)&(in_stack_fffffffffffff0c8->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4)) + 1.0;
      local_c80 = in_stack_fffffffffffff0c8;
      if ((local_bd0 <= local_c84) && (local_bd0 <= local_c88)) {
        local_c98 = *(undefined4 *)
                     &(in_stack_fffffffffffff0c8->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        local_c94 = *(undefined4 *)
                     ((long)&(in_stack_fffffffffffff0c8->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + 4);
        local_c90 = *(undefined4 *)
                     &(in_stack_fffffffffffff0c8->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
        local_c8c = *(undefined4 *)
                     ((long)&(in_stack_fffffffffffff0c8->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish + 4);
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffff020,
                   in_stack_fffffffffffff018);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffff020,&in_stack_fffffffffffff018->x1);
      }
    }
    in_stack_fffffffffffff0c0 = &local_c20;
    local_818 = in_stack_fffffffffffff0c0;
    local_4c8 = in_stack_fffffffffffff0c0;
    if (local_c18 != (int *)0x0) {
      local_4cc = 0xffffffff;
      LOCK();
      local_4d0 = *local_c18;
      *local_c18 = *local_c18 + -1;
      UNLOCK();
      if (local_4d0 == 1) {
        if (local_c00 == (long *)0x0) {
          local_370 = local_c20;
          if (local_c20 != (void *)0x0) {
            free(local_c20);
          }
        }
        else {
          (**(code **)(*local_c00 + 0x18))(local_c00,local_c20);
        }
      }
    }
    *in_stack_fffffffffffff0c0 = (void *)0x0;
    in_stack_fffffffffffff0c0[2] = (void *)0x0;
    *(undefined4 *)(in_stack_fffffffffffff0c0 + 3) = 0;
    *(undefined4 *)(in_stack_fffffffffffff0c0 + 5) = 0;
    *(undefined4 *)((long)in_stack_fffffffffffff0c0 + 0x2c) = 0;
    *(undefined4 *)(in_stack_fffffffffffff0c0 + 6) = 0;
    *(undefined4 *)((long)in_stack_fffffffffffff0c0 + 0x34) = 0;
    *(undefined4 *)(in_stack_fffffffffffff0c0 + 7) = 0;
    in_stack_fffffffffffff0c0[8] = (void *)0x0;
    in_stack_fffffffffffff0c0[1] = (void *)0x0;
  }
  qsort_descent_inplace<ncnn::Rect>
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffff020,
             (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff018);
  if ((0 < *(int *)(in_RDI + 0xd8)) &&
     (iVar9 = *(int *)(in_RDI + 0xd8),
     sVar3 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::size(&local_bb0),
     iVar9 < (int)sVar3)) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize
              ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffff030,
               in_stack_fffffffffffff028);
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_fffffffffffff030,in_stack_fffffffffffff028);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd607d2);
  nms_sorted_bboxes(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,fVar10);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_cb0);
  local_cb8 = (int)sVar3;
  piVar4 = std::min<int>(&local_cb8,(int *)(in_RDI + 0xdc));
  local_cb4 = *piVar4;
  local_cc0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_8b0,0);
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffff047,in_stack_fffffffffffff040),
              (int)((ulong)in_stack_fffffffffffff038 >> 0x20),(int)in_stack_fffffffffffff038,
              (int)((ulong)in_stack_fffffffffffff030 >> 0x20),in_stack_fffffffffffff028,
              (Allocator *)in_stack_fffffffffffff020);
  local_5f8 = local_cc0;
  bVar8 = true;
  if (local_cc0->data != (void *)0x0) {
    local_10 = local_cc0;
    bVar8 = local_cc0->cstep * (long)local_cc0->c == 0;
  }
  if (bVar8) {
    local_894 = -100;
  }
  else {
    for (local_cc8 = 0; iVar9 = (int)((ulong)in_stack_fffffffffffff030 >> 0x20),
        local_cc8 < local_cb4; local_cc8 = local_cc8 + 1) {
      local_6e0 = &local_d18;
      local_20c = local_cc0->w;
      local_210 = local_cc0->h;
      local_214 = local_cc0->d;
      local_cd0 = (float *)((long)local_cc0->data +
                           local_cc0->cstep * (long)local_cc8 * local_cc0->elemsize);
      local_228 = local_cc0->elemsize;
      local_22c = local_cc0->elempack;
      local_238 = local_cc0->allocator;
      local_208 = &local_d18;
      local_48 = (long)local_20c * (long)local_210 * local_228;
      local_5e8 = &local_d18;
      local_808 = &local_d18;
      local_4c = 0x10;
      local_6e8 = local_cc0;
      local_6ec = local_cc8;
      local_6ed = 1;
      local_d18 = 0;
      local_d08 = 0;
      local_d00 = 0;
      local_cf0 = 0;
      local_cec = 0;
      local_ce8 = 0;
      local_ce4 = 0;
      local_ce0 = 0;
      local_cd8 = 0;
      local_d10 = 0;
      local_4e8 = local_808;
      local_220 = local_cd0;
      local_cf8 = local_238;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_cb0,(long)local_cc8);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_bb0,*pvVar5);
      *local_cd0 = pvVar6->x1;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_cb0,(long)local_cc8);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_bb0,*pvVar5);
      local_cd0[1] = pvVar6->y1;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_cb0,(long)local_cc8);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_bb0,*pvVar5);
      local_cd0[2] = pvVar6->x2;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_cb0,(long)local_cc8);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_bb0,*pvVar5);
      local_cd0[3] = pvVar6->y2;
    }
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_8b0);
    if (1 < sVar3) {
      local_d20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_8b0,1);
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffff047,in_stack_fffffffffffff040),
                  (int)((ulong)in_stack_fffffffffffff038 >> 0x20),(int)in_stack_fffffffffffff038,
                  iVar9,in_stack_fffffffffffff028,(Allocator *)in_stack_fffffffffffff020);
      local_600 = local_d20;
      bVar8 = true;
      if (local_d20->data != (void *)0x0) {
        local_8 = local_d20;
        bVar8 = local_d20->cstep * (long)local_d20->c == 0;
      }
      if (bVar8) {
        local_894 = -100;
        goto LAB_00d613e5;
      }
      for (local_d24 = 0; local_d24 < local_cb4; local_d24 = local_d24 + 1) {
        local_700 = &local_d78;
        local_1d4 = local_d20->w;
        local_1d8 = local_d20->h;
        local_1dc = local_d20->d;
        in_stack_fffffffffffff020 =
             (vector<float,_std::allocator<float>_> *)
             ((long)local_d20->data + local_d20->cstep * (long)local_d24 * local_d20->elemsize);
        local_1f0 = local_d20->elemsize;
        local_1f4 = local_d20->elempack;
        local_200 = local_d20->allocator;
        local_1d0 = &local_d78;
        local_58 = (long)local_1d4 * (long)local_1d8 * local_1f0;
        local_5f0 = &local_d78;
        local_7f8 = &local_d78;
        local_5c = 0x10;
        local_708 = local_d20;
        local_70c = local_d24;
        local_70d = 1;
        local_d78 = 0;
        local_d68 = 0;
        local_d60 = 0;
        local_d50 = 0;
        local_d4c = 0;
        local_d48 = 0;
        local_d44 = 0;
        local_d40 = 0;
        local_d38 = 0;
        local_d70 = 0;
        local_d30 = in_stack_fffffffffffff020;
        local_508 = local_7f8;
        local_1e8 = in_stack_fffffffffffff020;
        local_d58 = local_200;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_cb0,(long)local_d24);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_bc8,*pvVar5);
        *(value_type *)
         &(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
           &local_d30->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
          super__Vector_impl_data._M_start = *pvVar7;
      }
    }
    local_894 = 0;
  }
LAB_00d613e5:
  local_cc4 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff020);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffff020);
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffff020);
  local_7e8 = &local_928;
  if (local_920 != (int *)0x0) {
    local_52c = 0xffffffff;
    LOCK();
    local_530 = *local_920;
    *local_920 = *local_920 + -1;
    UNLOCK();
    if (local_530 == 1) {
      local_528 = local_7e8;
      if (local_908 == (long *)0x0) {
        local_340 = local_928;
        if (local_928 != (void *)0x0) {
          free(local_928);
        }
      }
      else {
        (**(code **)(*local_908 + 0x18))(local_908,local_928);
      }
    }
  }
  return local_894;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * expf(dw);
                float pb_h = anchor_h * expf(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}